

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.hpp
# Opt level: O1

Display * lambda::operator<<(Display *display,
                            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *value)

{
  pointer pcVar1;
  Maybe<std::__cxx11::basic_string<char>_> *in_RDX;
  Maybe<std::__cxx11::basic_string<char>_> *extraout_RDX;
  bool bVar2;
  long *local_58 [2];
  long local_48 [2];
  char local_38;
  string local_30;
  
  local_38 = 0;
  bVar2 = (value->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          )._M_engaged == true;
  if (bVar2) {
    local_58[0] = local_48;
    pcVar1 = (value->
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ).field_0._M_payload._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar1,
               pcVar1 + (value->
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        ).field_0._M_payload._M_string_length);
    in_RDX = extraout_RDX;
  }
  local_38 = bVar2;
  show<std::__cxx11::string>(&local_30,(lambda *)local_58,in_RDX);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if ((local_38 == '\x01') && (local_58[0] != local_48)) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return display;
}

Assistant:

Display &operator<<(Display &display, const T value) {
    display << show(value);
    return display;
}